

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_sendmsg(int s,nn_msghdr *msghdr,int flags)

{
  nn_chunkref *self;
  uint uVar1;
  ulong uVar2;
  nn_iovec *pnVar3;
  nn_sock *self_00;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  nn_cmsghdr *cmsg;
  int *piVar7;
  size_t *psVar8;
  long lVar9;
  size_t size;
  bool bVar10;
  size_t sStack_b0;
  nn_sock *sock;
  nn_msg msg;
  
  iVar4 = nn_global_hold_socket(&sock,s);
  if (-1 < iVar4) {
    iVar4 = -0x16;
    if (msghdr != (nn_msghdr *)0x0) {
      uVar1 = msghdr->msg_iovlen;
      uVar5 = (ulong)uVar1;
      if ((int)uVar1 < 0) {
        iVar4 = -0x5a;
      }
      else {
        if (uVar5 == 0) {
          size = 0;
LAB_0010ed33:
          nn_msg_init(&msg,size);
          bVar10 = true;
          if (msghdr->msg_iovlen == 0) {
            sStack_b0 = 0;
          }
          else {
            lVar9 = 8;
            uVar5 = 0;
            sStack_b0 = 0;
            do {
              pnVar3 = msghdr->msg_iov;
              pvVar6 = nn_chunkref_data(&msg.body);
              memcpy((void *)((long)pvVar6 + sStack_b0),*(void **)((long)pnVar3 + lVar9 + -8),
                     *(size_t *)((long)&pnVar3->iov_base + lVar9));
              sStack_b0 = sStack_b0 + *(long *)((long)&pnVar3->iov_base + lVar9);
              uVar5 = uVar5 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar5 != (uint)msghdr->msg_iovlen);
          }
        }
        else {
          if ((uVar1 != 1) || (msghdr->msg_iov->iov_len != 0xffffffffffffffff)) {
            psVar8 = &msghdr->msg_iov->iov_len;
            size = 0;
            do {
              uVar2 = *psVar8;
              if (uVar2 == 0xffffffffffffffff) goto LAB_0010ef2d;
              if ((uVar2 != 0) && (((nn_iovec *)(psVar8 + -1))->iov_base == (void *)0x0)) {
                iVar4 = -0xe;
                goto LAB_0010ef2d;
              }
              bVar10 = CARRY8(size,uVar2);
              size = size + uVar2;
              if (bVar10) goto LAB_0010ef2d;
              psVar8 = psVar8 + 2;
              uVar5 = uVar5 - 1;
            } while (uVar5 != 0);
            goto LAB_0010ed33;
          }
          pvVar6 = *msghdr->msg_iov->iov_base;
          if (pvVar6 == (void *)0x0) {
            iVar4 = -0xe;
            goto LAB_0010ef2d;
          }
          sStack_b0 = nn_chunk_size(pvVar6);
          nn_msg_init_chunk(&msg,pvVar6);
          bVar10 = false;
        }
        if ((undefined8 *)msghdr->msg_control != (undefined8 *)0x0) {
          if (msghdr->msg_controllen == 0xffffffffffffffff) {
            pvVar6 = *msghdr->msg_control;
            nn_chunkref_term(&msg.hdrs);
            nn_chunkref_init_chunk(&msg.hdrs,pvVar6);
          }
          else {
            self = &msg.hdrs;
            nn_chunkref_term(self);
            nn_chunkref_init(self,msghdr->msg_controllen);
            pvVar6 = nn_chunkref_data(self);
            memcpy(pvVar6,msghdr->msg_control,msghdr->msg_controllen);
          }
          for (cmsg = nn_cmsg_nxthdr_(msghdr,(nn_cmsghdr *)0x0); cmsg != (nn_cmsghdr *)0x0;
              cmsg = nn_cmsg_nxthdr_(msghdr,cmsg)) {
            if ((cmsg->cmsg_level == 1) && (cmsg->cmsg_type == 1)) {
              if ((cmsg->cmsg_len - 0x19 < 0xfffffffffffffff7) &&
                 (uVar5 = cmsg[1].cmsg_len, uVar5 <= cmsg->cmsg_len - 0x18)) {
                nn_chunkref_term(&msg.sphdr);
                nn_chunkref_init(&msg.sphdr,uVar5);
                pvVar6 = nn_chunkref_data(&msg.sphdr);
                memcpy(pvVar6,&cmsg[1].cmsg_level,uVar5);
              }
              break;
            }
          }
        }
        self_00 = sock;
        iVar4 = nn_sock_send(sock,&msg,flags);
        if (-1 < iVar4) {
          nn_sock_stat_increment(self_00,0x12d,1);
          nn_sock_stat_increment(self_00,0x12f,sStack_b0);
          nn_mutex_lock(&::self.lock);
          nn_sock_rele(self_00);
          nn_mutex_unlock(&::self.lock);
          goto LAB_0010ee2b;
        }
        if (!bVar10) {
          nn_chunkref_init(&msg.body,0);
        }
        nn_msg_term(&msg);
      }
    }
LAB_0010ef2d:
    nn_mutex_lock(&::self.lock);
    nn_sock_rele(sock);
    nn_mutex_unlock(&::self.lock);
  }
  piVar7 = __errno_location();
  *piVar7 = -iVar4;
  sStack_b0 = 0xffffffffffffffff;
LAB_0010ee2b:
  return (int)sStack_b0;
}

Assistant:

int nn_sendmsg (int s, const struct nn_msghdr *msghdr, int flags)
{
    int rc;
    size_t sz;
    size_t spsz;
    int i;
    struct nn_iovec *iov;
    struct nn_msg msg;
    void *chunk;
    int nnmsg;
    struct nn_cmsghdr *cmsg;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!msghdr)) {
        rc = -EINVAL;
        goto fail;
    }

    if (nn_slow (msghdr->msg_iovlen < 0)) {
        rc = -EMSGSIZE;
        goto fail;
    }

    if (msghdr->msg_iovlen == 1 && msghdr->msg_iov [0].iov_len == NN_MSG) {
        chunk = *(void**) msghdr->msg_iov [0].iov_base;
        if (nn_slow (chunk == NULL)) {
            rc = -EFAULT;
            goto fail;
        }
        sz = nn_chunk_size (chunk);
        nn_msg_init_chunk (&msg, chunk);
        nnmsg = 1;
    }
    else {

        /*  Compute the total size of the message. */
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            if (nn_slow (iov->iov_len == NN_MSG)) {
               rc = -EINVAL;
               goto fail;
            }
            if (nn_slow (!iov->iov_base && iov->iov_len)) {
                rc = -EFAULT;
                goto fail;
            }
            if (nn_slow (sz + iov->iov_len < sz)) {
                rc = -EINVAL;
                goto fail;
            }
            sz += iov->iov_len;
        }

        /*  Create a message object from the supplied scatter array. */
        nn_msg_init (&msg, sz);
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            memcpy (((uint8_t*) nn_chunkref_data (&msg.body)) + sz,
                iov->iov_base, iov->iov_len);
            sz += iov->iov_len;
        }

        nnmsg = 0;
    }

    /*  Add ancillary data to the message. */
    if (msghdr->msg_control) {

        /*  Copy all headers. */
        /*  TODO: SP_HDR should not be copied here! */
        if (msghdr->msg_controllen == NN_MSG) {
            chunk = *((void**) msghdr->msg_control);
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init_chunk (&msg.hdrs, chunk);
        }
        else {
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init (&msg.hdrs, msghdr->msg_controllen);
            memcpy (nn_chunkref_data (&msg.hdrs),
                msghdr->msg_control, msghdr->msg_controllen);
        }

        /* Search for SP_HDR property. */
        cmsg = NN_CMSG_FIRSTHDR (msghdr);
        while (cmsg) {
            if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR) {
                unsigned char *ptr = NN_CMSG_DATA (cmsg);
                size_t clen = cmsg->cmsg_len - NN_CMSG_SPACE (0);
                if (clen > sizeof (size_t)) {
                    spsz = *(size_t *)(void *)ptr;
                    if (spsz <= (clen - sizeof (size_t))) {
                        /*  Copy body of SP_HDR property into 'sphdr'. */
                        nn_chunkref_term (&msg.sphdr);
                        nn_chunkref_init (&msg.sphdr, spsz);
                         memcpy (nn_chunkref_data (&msg.sphdr),
                             ptr + sizeof (size_t), spsz);
                    }
                }
                break;
            }
            cmsg = NN_CMSG_NXTHDR (msghdr, cmsg);
        }
    }

    /*  Send it further down the stack. */
    rc = nn_sock_send (sock, &msg, flags);
    if (nn_slow (rc < 0)) {

        /*  If we are dealing with user-supplied buffer, detach it from
            the message object. */
        if (nnmsg)
            nn_chunkref_init (&msg.body, 0);

        nn_msg_term (&msg);
        goto fail;
    }

    /*  Adjust the statistics. */
    nn_sock_stat_increment (sock, NN_STAT_MESSAGES_SENT, 1);
    nn_sock_stat_increment (sock, NN_STAT_BYTES_SENT, sz);

    nn_global_rele_socket (sock);

    return (int) sz;

fail:
    nn_global_rele_socket (sock);

    errno = -rc;
    return -1;
}